

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numGuess.cpp
# Opt level: O2

int main(void)

{
  uint uVar1;
  ostream *poVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  int iVar7;
  int iVar8;
  char playAgain;
  int magicNumber;
  int guess;
  int local_38;
  int local_34;
  
  playAgain = 'n';
LAB_00101223:
  iVar7 = 100;
  iVar8 = 1;
  magicNumber = 0;
  poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar2 = std::operator<<(poVar2,"Welcome to the number guessing game!");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar2 = std::operator<<((ostream *)&std::cout,"Player 1: Please enter an integer between ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,1);
  poVar2 = std::operator<<(poVar2," and ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,100);
  poVar2 = std::operator<<(poVar2," (inclusive).");
  std::endl<char,std::char_traits<char>>(poVar2);
  pcVar6 = "Floats will always be rounded down.";
  do {
    poVar2 = std::operator<<((ostream *)&std::cout,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar2);
    do {
      if (0xffffff9b < magicNumber - 0x65U) {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "Player 2: Please guess the number that player 1 chose.");
        std::endl<char,std::char_traits<char>>(poVar2);
        iVar4 = 0;
        local_38 = -1;
        goto LAB_00101303;
      }
      std::operator<<((ostream *)&std::cout,"Number please: ");
      std::istream::operator>>((istream *)&std::cin,&magicNumber);
      pcVar6 = "Number is out of bounds. Please try again";
    } while (0xffffff9b < magicNumber - 0x65U);
  } while( true );
LAB_00101303:
  if (iVar4 == 3) goto LAB_001014af;
  guess = 0;
  local_34 = iVar4;
  poVar2 = std::operator<<((ostream *)&std::cout,"You have ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,3 - iVar4);
  poVar2 = std::operator<<(poVar2," guesses remaining.");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Please choose a number between ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar8);
  poVar2 = std::operator<<(poVar2," and ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar7);
  std::operator<<(poVar2,".\n");
  while (guess < iVar8 || iVar7 < guess) {
    poVar2 = std::operator<<((ostream *)&std::cout,"(");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar8);
    poVar2 = std::operator<<(poVar2," - ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar7);
    std::operator<<(poVar2,"): ");
    std::istream::operator>>((istream *)&std::cin,&guess);
    if (guess < iVar8 || iVar7 < guess) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Number is out of bounds. Please try again");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
  }
  if (guess < magicNumber) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Your guess was too low!");
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar8 = guess + 1;
  }
  else {
    if (guess <= magicNumber) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Congrats! You won!");
      goto LAB_001014fb;
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"Your guess was too high!");
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar7 = guess + -1;
  }
  iVar4 = guess;
  if (local_38 != -1) {
    uVar5 = magicNumber - local_38;
    uVar1 = -uVar5;
    if (0 < (int)uVar5) {
      uVar1 = uVar5;
    }
    uVar3 = magicNumber - guess;
    uVar5 = -uVar3;
    if (0 < (int)uVar3) {
      uVar5 = uVar3;
    }
    iVar4 = local_38;
    if (uVar5 < uVar1) {
      iVar4 = guess;
    }
  }
  local_38 = iVar4;
  iVar4 = local_34 + 1;
  goto LAB_00101303;
LAB_001014af:
  poVar2 = std::operator<<((ostream *)&std::cout,"Player 2 lost. Player 1 had number ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,magicNumber);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Player 2\'s closest guess was ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_38);
LAB_001014fb:
  std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<((ostream *)&std::cout,"Enter \'y\' to play again: ");
  std::operator>>((istream *)&std::cin,&playAgain);
  iVar7 = tolower((int)playAgain);
  if (iVar7 != 0x79) {
    return 0;
  }
  goto LAB_00101223;
}

Assistant:

int main()
{
    const int NUM_GUESSES = 3;
    const int MIN_NUMBER = 1;
    const int MAX_NUMBER = 100;

    char playAgain = 'n';

    do
    {
        int magicNumber = MIN_NUMBER - 1;

        cout << endl << "Welcome to the number guessing game!" << endl;
        cout << endl;
        cout << "Player 1: Please enter an integer between " << MIN_NUMBER <<
                " and " << MAX_NUMBER << " (inclusive)." << endl;
        cout << "Floats will always be rounded down." << endl;

        while(outOfBounds(magicNumber, MIN_NUMBER, MAX_NUMBER))
        {

            cout << "Number please: ";
            cin >> magicNumber;

            if(outOfBounds(magicNumber, MIN_NUMBER, MAX_NUMBER))
            {
                cout << "Number is out of bounds. Please try again" << endl;
            }
        }

        // Guessing section
        int lowerBound = MIN_NUMBER;
        int upperBound = MAX_NUMBER;
        bool numGuessed = false;
        int closestGuess = -1;

        cout << "Player 2: Please guess the number that player 1 chose." << endl;

        for (int i = 0; i < NUM_GUESSES; i++)
        {

            int guess = MIN_NUMBER - 1;
            int remainingGuesses = NUM_GUESSES - i;


            cout << "You have " << remainingGuesses << " guesses remaining." << endl;
            cout << "Please choose a number between " << lowerBound << " and " << upperBound << ".\n";

            while(outOfBounds(guess, lowerBound, upperBound))
            {
                cout << "(" << lowerBound << " - " << upperBound << "): ";
                cin >> guess;

                if(outOfBounds(guess, lowerBound, upperBound))
                {
                    cout << "Number is out of bounds. Please try again" << endl;
                }
            }

            if(guess < magicNumber)
            {
                cout << "Your guess was too low!" << endl;
                lowerBound = guess + 1;

                if(closestGuess == -1)
                {
                    closestGuess = guess;
                }
                else
                {
                    if(abs(magicNumber - closestGuess) > abs(magicNumber - guess))
                    {
                        closestGuess = guess;
                    }
                }
            }
            else if(guess > magicNumber)
            {
                cout << "Your guess was too high!" << endl;
                upperBound = guess - 1;

                if(closestGuess == -1)
                {
                    closestGuess = guess;
                }
                else
                {
                    if(abs(magicNumber - closestGuess) > abs(magicNumber - guess))
                    {
                        closestGuess = guess;
                    }
                }
            }
            else
            {
                cout << "Congrats! You won!" << endl;
                numGuessed = true;
                break;
            }
        }

        if(!numGuessed)
        {
            cout << "Player 2 lost. Player 1 had number " << magicNumber << endl;
            cout << "Player 2's closest guess was " << closestGuess << endl;
        }

        cout << "Enter 'y' to play again: ";
        cin >> playAgain;

    } while (tolower(playAgain) == 'y');

    return 0;
}